

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O2

void NJamSpell::
     PrepareNgramKeys<std::unordered_map<std::pair<unsigned_int,unsigned_int>,unsigned_int,NJamSpell::TGram2KeyHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,unsigned_int>>>>
               (unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram2KeyHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
                *grams,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *keys)

{
  pair<unsigned_int,_unsigned_int> *in_RDX;
  pair<unsigned_int,_unsigned_int> *extraout_RDX;
  __node_base *p_Var1;
  string local_40;
  
  p_Var1 = &(grams->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    DumpKey<std::pair<unsigned_int,unsigned_int>>(&local_40,(NJamSpell *)(p_Var1 + 1),in_RDX);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)keys,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    in_RDX = extraout_RDX;
  }
  return;
}

Assistant:

void PrepareNgramKeys(const T& grams, std::vector<std::string>& keys) {
    for (auto&& it: grams) {
        keys.push_back(DumpKey(it.first));
    }
}